

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gost_grasshopper_cipher.c
# Opt level: O3

int gost_grasshopper_cipher_do_cfb(EVP_CIPHER_CTX *ctx,uchar *out,uchar *in,size_t inl)

{
  byte bVar1;
  byte bVar2;
  uint32_t uVar3;
  uint32_t uVar4;
  uint32_t uVar5;
  uint64_t uVar6;
  int iVar7;
  uint uVar8;
  long lVar9;
  grasshopper_w128_t *target;
  grasshopper_w128_t *source;
  ulong uVar10;
  long lVar11;
  ulong uVar12;
  ulong uVar13;
  
  lVar9 = EVP_CIPHER_CTX_get_cipher_data();
  target = (grasshopper_w128_t *)EVP_CIPHER_CTX_buf_noconst(ctx);
  source = (grasshopper_w128_t *)EVP_CIPHER_CTX_iv_noconst(ctx);
  iVar7 = EVP_CIPHER_CTX_is_encrypting(ctx);
  uVar8 = EVP_CIPHER_CTX_get_num(ctx);
  if ((int)uVar8 < 1) {
    uVar13 = 0;
  }
  else {
    uVar10 = (ulong)uVar8;
    uVar13 = 0;
    uVar12 = uVar10;
    if (inl != 0 && uVar8 < 0x10) {
      do {
        if (iVar7 == 0) {
          bVar1 = in[uVar13];
          target->b[uVar10 + 0x10] = bVar1;
          out[uVar13] = bVar1 ^ target->b[uVar10];
        }
        else {
          bVar1 = in[uVar13];
          bVar2 = target->b[uVar10];
          out[uVar13] = bVar1 ^ bVar2;
          target->b[uVar10 + 0x10] = bVar1 ^ bVar2;
        }
        uVar12 = uVar10 + 1;
        uVar13 = uVar13 + 1;
      } while ((uVar10 < 0xf) && (uVar10 = uVar12, uVar13 < inl));
      in = in + uVar13;
      out = out + uVar13;
    }
    if (uVar12 != 0x10) goto LAB_0011ccc6;
    uVar3 = *(uint32_t *)((long)target + 0x14);
    uVar4 = *(uint32_t *)((long)target + 0x18);
    uVar5 = *(uint32_t *)((long)target + 0x1c);
    source->d[0] = target[1].d[0];
    source->d[1] = uVar3;
    source->d[2] = uVar4;
    source->d[3] = uVar5;
    EVP_CIPHER_CTX_set_num(ctx,0);
  }
  if (uVar13 + 0x10 < inl) {
    uVar12 = uVar13 + 0x10;
    do {
      uVar13 = uVar12;
      grasshopper_encrypt_block
                ((grasshopper_round_keys_t *)(lVar9 + 0x48),source,target,
                 (grasshopper_w128_t *)(lVar9 + 0x188));
      if (iVar7 == 0) {
        uVar6 = *(uint64_t *)((long)in + 8);
        source->q[0] = *(uint64_t *)in;
        source->q[1] = uVar6;
      }
      lVar11 = 0;
      do {
        *(byte *)((long)out + lVar11) = *(byte *)((long)in + lVar11) ^ target->b[lVar11];
        lVar11 = lVar11 + 1;
      } while (lVar11 != 0x10);
      if (iVar7 != 0) {
        uVar6 = *(uint64_t *)((long)out + 8);
        source->q[0] = *(uint64_t *)out;
        source->q[1] = uVar6;
      }
      in = (uchar *)((long)in + 0x10);
      out = (uchar *)((long)out + 0x10);
      uVar12 = uVar13 + 0x10;
    } while (uVar13 + 0x10 < inl);
  }
  uVar12 = inl - uVar13;
  if (uVar13 <= inl && uVar12 != 0) {
    grasshopper_encrypt_block
              ((grasshopper_round_keys_t *)(lVar9 + 0x48),source,target,
               (grasshopper_w128_t *)(lVar9 + 0x188));
    if (iVar7 == 0) {
      memcpy(target + 1,in,uVar12);
    }
    uVar13 = 0;
    do {
      *(byte *)((long)out + uVar13) = *(byte *)((long)in + uVar13) ^ target->b[uVar13];
      uVar13 = uVar13 + 1;
    } while (uVar12 != uVar13);
    EVP_CIPHER_CTX_set_num(ctx,uVar12 & 0xffffffff);
    if (iVar7 == 0) {
      return 1;
    }
    memcpy(target + 1,out,uVar12);
    return 1;
  }
  uVar12 = 0;
LAB_0011ccc6:
  EVP_CIPHER_CTX_set_num(ctx,uVar12);
  return 1;
}

Assistant:

static int gost_grasshopper_cipher_do_cfb(EVP_CIPHER_CTX *ctx, unsigned char *out,
                                          const unsigned char *in, size_t inl)
{
    gost_grasshopper_cipher_ctx *c =
        (gost_grasshopper_cipher_ctx *) EVP_CIPHER_CTX_get_cipher_data(ctx);
    const unsigned char *in_ptr = in;
    unsigned char *out_ptr = out;
    unsigned char *buf = EVP_CIPHER_CTX_buf_noconst(ctx);
    unsigned char *iv = EVP_CIPHER_CTX_iv_noconst(ctx);
    bool encrypting = (bool) EVP_CIPHER_CTX_encrypting(ctx);
    int num = EVP_CIPHER_CTX_num(ctx);
    size_t i = 0;
    size_t j = 0;

    /* process partial block if any */
    if (num > 0) {
        for (j = (size_t)num, i = 0; j < GRASSHOPPER_BLOCK_SIZE && i < inl;
             j++, i++, in_ptr++, out_ptr++) {
            if (!encrypting) {
                buf[j + GRASSHOPPER_BLOCK_SIZE] = *in_ptr;
            }
            *out_ptr = buf[j] ^ (*in_ptr);
            if (encrypting) {
                buf[j + GRASSHOPPER_BLOCK_SIZE] = *out_ptr;
            }
        }
        if (j == GRASSHOPPER_BLOCK_SIZE) {
            memcpy(iv, buf + GRASSHOPPER_BLOCK_SIZE, GRASSHOPPER_BLOCK_SIZE);
            EVP_CIPHER_CTX_set_num(ctx, 0);
        } else {
            EVP_CIPHER_CTX_set_num(ctx, (int)j);
            return 1;
        }
    }

    for (; i + GRASSHOPPER_BLOCK_SIZE <
         inl;
         i += GRASSHOPPER_BLOCK_SIZE, in_ptr +=
         GRASSHOPPER_BLOCK_SIZE, out_ptr += GRASSHOPPER_BLOCK_SIZE) {
        /*
         * block cipher current iv
         */
        grasshopper_encrypt_block(&c->encrypt_round_keys,
                                  (grasshopper_w128_t *) iv,
                                  (grasshopper_w128_t *) buf, &c->buffer);
        /*
         * xor next block of input text with it and output it
         */
        /*
         * output this block
         */
        if (!encrypting) {
            memcpy(iv, in_ptr, GRASSHOPPER_BLOCK_SIZE);
        }
        for (j = 0; j < GRASSHOPPER_BLOCK_SIZE; j++) {
            out_ptr[j] = buf[j] ^ in_ptr[j];
        }
        /* Encrypt */
        /* Next iv is next block of cipher text */
        if (encrypting) {
            memcpy(iv, out_ptr, GRASSHOPPER_BLOCK_SIZE);
        }
    }

    /* Process rest of buffer */
    if (i < inl) {
        grasshopper_encrypt_block(&c->encrypt_round_keys,
                                  (grasshopper_w128_t *) iv,
                                  (grasshopper_w128_t *) buf, &c->buffer);
        if (!encrypting) {
            memcpy(buf + GRASSHOPPER_BLOCK_SIZE, in_ptr, inl - i);
        }
        for (j = 0; i < inl; j++, i++) {
            out_ptr[j] = buf[j] ^ in_ptr[j];
        }
        EVP_CIPHER_CTX_set_num(ctx, (int)j);
        if (encrypting) {
            memcpy(buf + GRASSHOPPER_BLOCK_SIZE, out_ptr, j);
        }
    } else {
        EVP_CIPHER_CTX_set_num(ctx, 0);
    }

    return 1;
}